

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O1

void __thiscall Board::print(Board *this,string *messageToPrint)

{
  int iVar1;
  undefined8 in_RAX;
  ostream *poVar2;
  long *plVar3;
  long lVar4;
  int i;
  long lVar5;
  char *pcVar6;
  int j;
  long lVar7;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"===========================",0x1b);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  plVar3 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(messageToPrint->_M_dataplus)._M_p,
                      messageToPrint->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  lVar5 = 0;
  do {
    lVar7 = 0;
    do {
      iVar1 = this->cells[0][lVar7];
      if (iVar1 == 0) {
        lVar4 = 2;
        poVar2 = (ostream *)&std::cout;
        pcVar6 = ". ";
      }
      else {
        uStack_38 = CONCAT17((char)iVar1 + '@',(undefined7)uStack_38);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)((long)&uStack_38 + 7),1);
        lVar4 = 1;
        pcVar6 = " ";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,lVar4);
      lVar7 = lVar7 + 1;
    } while (lVar7 != 6);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
    std::ostream::put('P');
    std::ostream::flush();
    lVar5 = lVar5 + 1;
    this = (Board *)(this->cells + 1);
  } while (lVar5 != 6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"===========================",0x1b);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  plVar3 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  return;
}

Assistant:

void Board::print(const string messageToPrint) {
    printSeperator();
    pp(messageToPrint);
    for (int i = 0; i < BOARD_SIZE; ++i) {
        for (int j = 0; j < BOARD_SIZE; ++j) {
            if (cells[i][j] == 0) {
                cout << ". ";
            } else {
                cout << static_cast<char>(cells[i][j] + 64) << " ";
            }
        }
        cout << endl;
    }
    printSeperator();
}